

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O3

WJTL_STATUS
VerifyJsonParsesAsListOfNumbers
          (_Bool IsJson5,char *Json,uint64_t *NumberArray,size_t NumberArrayCount)

{
  JlDataObject *pJVar1;
  size_t sVar2;
  JL_STATUS JVar3;
  WJTL_STATUS WVar4;
  JL_DATA_TYPE JVar5;
  uint32_t uVar6;
  JL_STATUS JVar7;
  ulong uVar8;
  JlDataObject *object;
  JlDataObject *listObject;
  uint64_t u64;
  size_t errorAtPos;
  JlDataObject *local_68;
  JlDataObject *local_60;
  ulong local_58;
  uint64_t local_50;
  JlListItem *local_48;
  uint64_t *local_40;
  size_t local_38;
  
  local_60 = (JlDataObject *)0x0;
  local_38 = 100;
  local_68 = (JlDataObject *)0x0;
  JVar3 = JlParseJsonEx(Json,IsJson5,&local_60,&local_38);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfNumbers",0x20d);
  pJVar1 = local_60;
  WVar4 = WJTL_STATUS_FAILED;
  if (JVar3 == JL_STATUS_SUCCESS) {
    local_58 = NumberArrayCount;
    local_40 = NumberArray;
    WjTestLib_Assert(local_60 != (JlDataObject *)0x0,"(listObject) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x210);
    JVar5 = JlGetObjectType(local_60);
    WjTestLib_Assert(JVar5 == JL_DATA_TYPE_LIST,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x211);
    sVar2 = local_38;
    WjTestLib_Assert(local_38 == 0,"errorAtPos == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x212);
    uVar6 = JlGetListCount(local_60);
    WVar4 = WJTL_STATUS_SUCCESS;
    if (uVar6 != local_58) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    if (sVar2 != 0) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    if (JVar5 != JL_DATA_TYPE_LIST) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    if (pJVar1 == (JlDataObject *)0x0) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(uVar6 == local_58,"JlGetListCount( listObject ) == NumberArrayCount",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x214);
    local_48 = (JlListItem *)0x0;
    if (local_58 != 0) {
      uVar8 = 0;
      do {
        local_50 = 0xffffffffffffffff;
        local_68 = (JlDataObject *)0x0;
        JVar3 = JlGetObjectListNextItem(local_60,&local_68,&local_48);
        WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                         "((JL_STATUS)(JlGetObjectListNextItem( listObject, &object, &enumerator ))) == (JL_STATUS_SUCCESS)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsListOfNumbers",0x21c);
        pJVar1 = local_68;
        WjTestLib_Assert(local_68 != (JlDataObject *)0x0,"(object) != NULL",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsListOfNumbers",0x21d);
        JVar7 = JlGetObjectNumberU64(local_68,&local_50);
        WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                         "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsListOfNumbers",0x21e);
        if (local_50 != local_40[uVar8]) {
          WVar4 = WJTL_STATUS_FAILED;
        }
        if (JVar7 != JL_STATUS_SUCCESS || JVar3 != JL_STATUS_SUCCESS) {
          WVar4 = WJTL_STATUS_FAILED;
        }
        if (pJVar1 == (JlDataObject *)0x0) {
          WVar4 = WJTL_STATUS_FAILED;
        }
        WjTestLib_Assert(local_50 == local_40[uVar8],"u64 == NumberArray[i]",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsListOfNumbers",0x21f);
        uVar8 = uVar8 + 1;
      } while (local_58 != uVar8);
    }
    JVar3 = JlGetObjectListNextItem(local_60,&local_68,&local_48);
    WjTestLib_Assert(JVar3 == JL_STATUS_END_OF_DATA,
                     "(JlGetObjectListNextItem( listObject, &object, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x223);
    JVar7 = JlFreeObjectTree(&local_60);
    if (JVar7 != JL_STATUS_SUCCESS) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    if (JVar3 != JL_STATUS_END_OF_DATA) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x226);
  }
  return WVar4;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        uint64_t*       NumberArray,
        size_t          NumberArrayCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   object = NULL;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    if( WJTL_STATUS_SUCCESS == TestReturn )
    {
        JL_ASSERT_NOT_NULL( listObject );
        JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
        JL_ASSERT( errorAtPos == 0 );

        JL_ASSERT( JlGetListCount( listObject ) == NumberArrayCount );

        // Verify all elements in list match array
        enumerator = NULL;
        for( size_t i=0; i<NumberArrayCount; i++ )
        {
            uint64_t u64 = UINT64_MAX;
            object = NULL;
            JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &object, &enumerator ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            JL_ASSERT( u64 == NumberArray[i] );
        }

        // Verify there are no more items in the list
        JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &object, &enumerator ), JL_STATUS_END_OF_DATA );

        // Clean up
        JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );
    }

    return TestReturn;
}